

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

uint syncsearch(uint *have,uchar *buf,uint len)

{
  uchar uVar1;
  uint local_24;
  uint local_20;
  uint next;
  uint got;
  uint len_local;
  uchar *buf_local;
  uint *have_local;
  
  local_20 = *have;
  for (local_24 = 0; local_24 < len && local_20 < 4; local_24 = local_24 + 1) {
    uVar1 = 0xff;
    if (local_20 < 2) {
      uVar1 = '\0';
    }
    if (buf[local_24] == uVar1) {
      local_20 = local_20 + 1;
    }
    else if (buf[local_24] == '\0') {
      local_20 = 4 - local_20;
    }
    else {
      local_20 = 0;
    }
  }
  *have = local_20;
  return local_24;
}

Assistant:

local unsigned syncsearch(unsigned FAR *have, const unsigned char FAR *buf,
                          unsigned len) {
    unsigned got;
    unsigned next;

    got = *have;
    next = 0;
    while (next < len && got < 4) {
        if ((int)(buf[next]) == (got < 2 ? 0 : 0xff))
            got++;
        else if (buf[next])
            got = 0;
        else
            got = 4 - got;
        next++;
    }
    *have = got;
    return next;
}